

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O0

LogMessage * __thiscall
absl::lts_20250127::log_internal::LogMessage::ToSinkAlso
          (LogMessage *this,Nonnull<absl::LogSink_*> sink)

{
  pointer pLVar1;
  int local_88 [2];
  char *local_80;
  char *absl_raw_log_internal_filename;
  string local_70 [55];
  allocator<char> local_39;
  undefined1 local_38 [8];
  string death_message;
  Nonnull<absl::LogSink_*> sink_local;
  LogMessage *this_local;
  
  death_message.field_2._8_8_ = sink;
  if (sink != (Nonnull<absl::LogSink_*>)0x0) {
    pLVar1 = std::
             unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             ::operator->(&this->data_);
    InlinedVector<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>
    ::push_back(&pLVar1->extra_sinks,(const_reference)((long)&death_message.field_2 + 8));
    return this;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,"Check sink failed: ",&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"null LogSink*",(allocator<char> *)((long)&absl_raw_log_internal_filename + 7)
            );
  std::__cxx11::string::operator+=((string *)local_38,local_70);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&absl_raw_log_internal_filename + 7));
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/log/internal/log_message.cc"
  ;
  local_88[1] = 3;
  local_88[0] = 0x163;
  base_internal::
  AtomicHook<void(*)(absl::lts_20250127::LogSeverity,char_const*,int,std::__cxx11::string_const&)>::
  operator()((AtomicHook<void(*)(absl::lts_20250127::LogSeverity,char_const*,int,std::__cxx11::string_const&)>
              *)raw_log_internal::internal_log_function_abi_cxx11_,(LogSeverity *)(local_88 + 1),
             &local_80,local_88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/log/internal/log_message.cc"
                ,0x163,
                "LogMessage &absl::log_internal::LogMessage::ToSinkAlso(absl::Nonnull<absl::LogSink *>)"
               );
}

Assistant:

LogMessage& LogMessage::ToSinkAlso(absl::Nonnull<absl::LogSink*> sink) {
  ABSL_INTERNAL_CHECK(sink, "null LogSink*");
  data_->extra_sinks.push_back(sink);
  return *this;
}